

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::constraintSecondPartialDerivativeWRTState
          (ConstraintsGroup *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *lambda,MatrixDynSize *hessian)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  __shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  element_type *peVar7;
  ostream *poVar8;
  string *psVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  ulong in_R8;
  undefined8 in_XMM0_Qa;
  ostringstream errorMsg_5;
  ostringstream errorMsg_4;
  ostringstream errorMsg_3;
  reverse_iterator constraintIterator;
  ostringstream errorMsg_2;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  TimedConstraint_ptr loneConstraint;
  DenseBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>_>
  *in_stack_fffffffffffff408;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff410;
  vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
  *in_stack_fffffffffffff418;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
  *in_stack_fffffffffffff420;
  VectorDynSize *in_stack_fffffffffffff428;
  ostringstream *this_00;
  double in_stack_fffffffffffff430;
  ConstraintsGroupPimpl *in_stack_fffffffffffff438;
  string local_aa0 [32];
  ostringstream local_a80 [376];
  string local_908 [32];
  ostringstream local_8e8 [376];
  string local_770 [32];
  ostringstream local_750 [544];
  string local_530 [32];
  ostringstream local_510 [376];
  string local_398 [32];
  ostringstream local_378 [380];
  undefined4 local_1fc;
  string local_1f8 [32];
  ostringstream local_1d8 [392];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_50;
  ulong local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  byte local_1;
  
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  bVar2 = isAnyTimeGroup((ConstraintsGroup *)in_stack_fffffffffffff438);
  uVar1 = local_38;
  if (bVar2) {
    local_50._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
         ::begin((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
                  *)in_stack_fffffffffffff408);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                  *)0x39965b);
    std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>::shared_ptr
              ((shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)in_stack_fffffffffffff410,
               (shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)in_stack_fffffffffffff408);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x399684);
    peVar6 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x39968c);
    uVar3 = (*peVar6->_vptr_Constraint[10])(local_18,peVar6,local_20,local_28,local_30,local_38);
    if ((uVar3 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1d8);
      poVar8 = std::operator<<((ostream *)local_1d8,"Failed to evaluate ");
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x399715);
      peVar6 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x39971d);
      psVar9 = Constraint::name_abi_cxx11_(peVar6);
      poVar8 = std::operator<<(poVar8,(string *)psVar9);
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar10 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",pcVar10);
      std::__cxx11::string::~string(local_1f8);
      local_1 = 0;
      local_1fc = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1d8);
    }
    else {
      lVar11 = iDynTree::MatrixDynSize::rows();
      lVar12 = iDynTree::VectorDynSize::size();
      if (lVar11 == lVar12) {
        lVar11 = iDynTree::MatrixDynSize::cols();
        lVar12 = iDynTree::VectorDynSize::size();
        if (lVar11 == lVar12) {
          local_1 = 1;
          local_1fc = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_510);
          poVar8 = std::operator<<((ostream *)local_510,
                                   "The second partial derivative WRT the state of constraint ");
          std::
          __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x399a5a);
          peVar6 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x399a62);
          psVar9 = Constraint::name_abi_cxx11_(peVar6);
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          poVar8 = std::operator<<(poVar8,
                                   " has a number of columns different from the size of the state.")
          ;
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError
                    ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",pcVar10);
          std::__cxx11::string::~string(local_530);
          local_1 = 0;
          local_1fc = 1;
          std::__cxx11::ostringstream::~ostringstream(local_510);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_378);
        poVar8 = std::operator<<((ostream *)local_378,
                                 "The second partial derivative WRT the state of constraint ");
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3998b5);
        peVar6 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x3998bd);
        psVar9 = Constraint::name_abi_cxx11_(peVar6);
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        poVar8 = std::operator<<(poVar8,
                                 " has a number of rows different from the size of the state.");
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError
                  ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",pcVar10);
        std::__cxx11::string::~string(local_398);
        local_1 = 0;
        local_1fc = 1;
        std::__cxx11::ostringstream::~ostringstream(local_378);
      }
    }
    std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>::~shared_ptr
              ((shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)0x399b98);
  }
  else {
    uVar4 = iDynTree::VectorDynSize::size();
    iDynTree::VectorDynSize::size();
    iDynTree::MatrixDynSize::resize(uVar1,uVar4);
    ConstraintsGroupPimpl::findActiveConstraint(in_stack_fffffffffffff438,in_stack_fffffffffffff430)
    ;
    std::
    vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
    ::rend(in_stack_fffffffffffff418);
    bVar2 = std::operator==(in_stack_fffffffffffff420,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                             *)in_stack_fffffffffffff418);
    if (bVar2) {
      toEigen((MatrixDynSize *)in_stack_fffffffffffff438);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      setZero(in_stack_fffffffffffff410);
      local_1 = 1;
    }
    else {
      toEigen(in_stack_fffffffffffff428);
      p_Var5 = &std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                              *)in_stack_fffffffffffff410)->
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
      ;
      std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::get
                (p_Var5);
      iDynTree::VectorDynSize::size();
      Eigen::
      DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::topRows<unsigned_long>
                ((DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)in_stack_fffffffffffff438,(unsigned_long)in_stack_fffffffffffff430);
      p_Var5 = &std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                              *)in_stack_fffffffffffff410)->
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
      ;
      std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::get
                (p_Var5);
      toEigen(in_stack_fffffffffffff428);
      Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 in_stack_fffffffffffff410,in_stack_fffffffffffff408);
      p_Var5 = &std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                              *)in_stack_fffffffffffff410)->
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
      ;
      std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::get
                (p_Var5);
      peVar6 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x399d2f);
      p_Var5 = &std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                              *)in_stack_fffffffffffff410)->
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
      ;
      peVar7 = std::
               __shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
               get(p_Var5);
      uVar3 = (*peVar6->_vptr_Constraint[10])
                        (local_18,peVar6,local_20,local_28,&peVar7->lambdaBuffer,local_38);
      if ((uVar3 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_750);
        poVar8 = std::operator<<((ostream *)local_750,"Failed to evaluate ");
        p_Var5 = &std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                *)in_stack_fffffffffffff410)->
                  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
        ;
        std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
        get(p_Var5);
        peVar6 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x399e1e);
        psVar9 = Constraint::name_abi_cxx11_(peVar6);
        poVar8 = std::operator<<(poVar8,(string *)psVar9);
        std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar10 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError
                  ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",pcVar10);
        std::__cxx11::string::~string(local_770);
        local_1 = 0;
        local_1fc = 1;
        std::__cxx11::ostringstream::~ostringstream(local_750);
      }
      else {
        lVar11 = iDynTree::MatrixDynSize::rows();
        lVar12 = iDynTree::VectorDynSize::size();
        if (lVar11 == lVar12) {
          lVar11 = iDynTree::MatrixDynSize::cols();
          lVar12 = iDynTree::VectorDynSize::size();
          if (lVar11 == lVar12) {
            local_1 = 1;
          }
          else {
            this_00 = local_a80;
            std::__cxx11::ostringstream::ostringstream(this_00);
            poVar8 = std::operator<<((ostream *)this_00,
                                     "The second partial derivative WRT the state of constraint ");
            p_Var5 = &std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                    *)in_stack_fffffffffffff410)->
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ::get(p_Var5);
            peVar6 = std::
                     __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x39a117);
            psVar9 = Constraint::name_abi_cxx11_(peVar6);
            poVar8 = std::operator<<(poVar8,(string *)psVar9);
            poVar8 = std::operator<<(poVar8,
                                     " has a number of columns different from the size of the state."
                                    );
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            std::__cxx11::ostringstream::str();
            pcVar10 = (char *)std::__cxx11::string::c_str();
            iDynTree::reportError
                      ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",pcVar10);
            std::__cxx11::string::~string(local_aa0);
            local_1 = 0;
            local_1fc = 1;
            std::__cxx11::ostringstream::~ostringstream(local_a80);
          }
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_8e8);
          poVar8 = std::operator<<((ostream *)local_8e8,
                                   "The second partial derivative WRT the state of constraint ");
          p_Var5 = &std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                  *)in_stack_fffffffffffff410)->
                    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
          ;
          std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
          get(p_Var5);
          peVar6 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x399f90);
          psVar9 = Constraint::name_abi_cxx11_(peVar6);
          poVar8 = std::operator<<(poVar8,(string *)psVar9);
          poVar8 = std::operator<<(poVar8,
                                   " has a number of rows different from the size of the state.");
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar10 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError
                    ("ConstraintsGroup","constraintSecondPartialDerivativeWRTState",pcVar10);
          std::__cxx11::string::~string(local_908);
          local_1 = 0;
          local_1fc = 1;
          std::__cxx11::ostringstream::~ostringstream(local_8e8);
        }
      }
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool ConstraintsGroup::constraintSecondPartialDerivativeWRTState(double time, const VectorDynSize &state, const VectorDynSize &control, const VectorDynSize &lambda, MatrixDynSize &hessian)
        {
            if (isAnyTimeGroup()){
                TimedConstraint_ptr loneConstraint = m_pimpl->group.begin()->second;
                if (!(loneConstraint->constraint->constraintSecondPartialDerivativeWRTState(time, state, control, lambda, hessian))) {
                    std::ostringstream errorMsg;
                    errorMsg << "Failed to evaluate "<< loneConstraint->constraint->name() << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The second partial derivative WRT the state of constraint "<< loneConstraint->constraint->name() << " has a number of rows different from the size of the state." << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.cols() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The second partial derivative WRT the state of constraint "<< loneConstraint->constraint->name() << " has a number of columns different from the size of the state." << std::endl;
                    reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                return true;
            }

            hessian.resize(state.size(), state.size());

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()){ //no active constraint
                toEigen(hessian).setZero();
                return true;
            }

            toEigen(constraintIterator->get()->lambdaBuffer) = toEigen(lambda).topRows(constraintIterator->get()->lambdaBuffer.size());

            if (!(constraintIterator->get()->constraint->constraintSecondPartialDerivativeWRTState(time, state, control, constraintIterator->get()->lambdaBuffer, hessian))) {
                std::ostringstream errorMsg;
                errorMsg << "Failed to evaluate "<< constraintIterator->get()->constraint->name() << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                return false;
            }

            if (hessian.rows() != state.size()) {
                std::ostringstream errorMsg;
                errorMsg << "The second partial derivative WRT the state of constraint "<< constraintIterator->get()->constraint->name() << " has a number of rows different from the size of the state." << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                return false;
            }

            if (hessian.cols() != state.size()) {
                std::ostringstream errorMsg;
                errorMsg << "The second partial derivative WRT the state of constraint "<< constraintIterator->get()->constraint->name() << " has a number of columns different from the size of the state." << std::endl;
                reportError("ConstraintsGroup", "constraintSecondPartialDerivativeWRTState", errorMsg.str().c_str());
                return false;
            }

            return true;
        }